

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

void extend_dill_stream(dill_stream_conflict s)

{
  private_ctx pdVar1;
  char *__src;
  char *pcVar2;
  char *__dest;
  int iVar3;
  size_t __n;
  size_t __len;
  
  pdVar1 = s->p;
  __src = pdVar1->code_base;
  pcVar2 = pdVar1->cur_ip;
  iVar3 = *(int *)&pdVar1->code_limit - (int)__src;
  __len = (size_t)(iVar3 * 2 + 0x78);
  __dest = (char *)mmap((void *)0x0,__len,7,0x22,-1,0);
  if (__dest == (char *)0xffffffffffffffff) {
    perror("mmap1");
  }
  __n = (size_t)(iVar3 + 0x3c);
  memcpy(__dest,__src,__n);
  s->p->code_base = __dest;
  iVar3 = munmap(__src,__n);
  if (iVar3 == -1) {
    perror("munmap exp");
  }
  pdVar1 = s->p;
  pdVar1->cur_ip = pdVar1->code_base + ((int)pcVar2 - (int)__src);
  pdVar1->code_limit = pdVar1->code_base + (__len - 0x3c);
  return;
}

Assistant:

extern void
extend_dill_stream(dill_stream s)
{
    int size = (int)((char*)s->p->code_limit - (char*)s->p->code_base +
                     END_OF_CODE_BUFFER);
    int cur_ip = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);
    int new_size = size * 2;
#ifdef USE_MMAP_CODE_SEG
    {
        void* old = s->p->code_base;
        void* new = mmap(0, new_size, PROT_EXEC | PROT_READ | PROT_WRITE,
                         MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
        if (new == (void*)-1)
            perror("mmap1");
        memcpy(new, old, size);
        s->p->code_base = new;
        if (munmap(old, size) == -1)
            perror("munmap exp");
    }
#else
    s->p->code_base = realloc(s->p->code_base, new_size);
#endif
    s->p->cur_ip = ((char*)s->p->code_base) + cur_ip;
    s->p->code_limit = ((char*)s->p->code_base) + new_size - END_OF_CODE_BUFFER;
}